

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O3

void hts_idx_save_core(hts_idx_t *idx,void *fp,int fmt)

{
  int32_t *data;
  bins_t *pbVar1;
  lidx_t *plVar2;
  bidx_t *pbVar3;
  long lVar4;
  uint uVar5;
  byte bVar6;
  int32_t size;
  khint_t local_5c;
  bidx_t *local_58;
  lidx_t *local_50;
  long local_48;
  int32_t *local_40;
  hts_idx_t *local_38;
  
  data = &idx->n;
  if (fmt == 1) {
    fwrite(data,1,4,(FILE *)fp);
  }
  else {
    bgzf_write((BGZF *)fp,data,4);
    if ((fmt == 2) && ((ulong)idx->l_meta != 0)) {
      bgzf_write((BGZF *)fp,idx->meta,(ulong)idx->l_meta);
    }
  }
  if (0 < *data) {
    lVar4 = 0;
    local_40 = data;
    local_38 = idx;
    do {
      local_58 = idx->bidx[lVar4];
      local_5c = 0;
      if (local_58 != (bidx_t *)0x0) {
        local_5c = local_58->size;
      }
      local_50 = idx->lidx + lVar4;
      local_48 = lVar4;
      if (fmt == 1) {
        fwrite(&local_5c,1,4,(FILE *)fp);
      }
      else {
        bgzf_write((BGZF *)fp,&local_5c,4);
      }
      if ((local_58 != (bidx_t *)0x0) && (local_58->n_buckets != 0)) {
        bVar6 = 0;
        uVar5 = 0;
        pbVar3 = local_58;
        do {
          if ((pbVar3->flags[uVar5 >> 4] >> (bVar6 & 0x1e) & 3) == 0) {
            pbVar1 = pbVar3->vals;
            if (fmt == 1) {
              fwrite(pbVar3->keys + uVar5,1,4,(FILE *)fp);
              fwrite(&pbVar1[uVar5].n,1,4,(FILE *)fp);
              fwrite(pbVar1[uVar5].list,1,(long)(pbVar1[uVar5].n << 4),(FILE *)fp);
              pbVar3 = local_58;
            }
            else {
              bgzf_write((BGZF *)fp,pbVar3->keys + uVar5,4);
              if (fmt == 0) {
                bgzf_write((BGZF *)fp,&local_58->vals[uVar5].loff,8);
              }
              bgzf_write((BGZF *)fp,&pbVar1[uVar5].n,4);
              bgzf_write((BGZF *)fp,pbVar1[uVar5].list,(long)(pbVar1[uVar5].n << 4));
              pbVar3 = local_58;
            }
          }
          uVar5 = uVar5 + 1;
          bVar6 = bVar6 + 2;
        } while (uVar5 != pbVar3->n_buckets);
      }
      idx = local_38;
      plVar2 = local_50;
      if (fmt != 0) {
        if (fmt == 1) {
          fwrite(local_50,1,4,(FILE *)fp);
          fwrite(plVar2->offset,1,(long)(plVar2->n << 3),(FILE *)fp);
        }
        else {
          bgzf_write((BGZF *)fp,local_50,4);
          bgzf_write((BGZF *)fp,plVar2->offset,(long)(plVar2->n << 3));
        }
      }
      lVar4 = local_48 + 1;
    } while (lVar4 < *local_40);
  }
  if (fmt == 1) {
    fwrite(&idx->n_no_coor,1,8,(FILE *)fp);
  }
  else {
    bgzf_write((BGZF *)fp,&idx->n_no_coor,8);
  }
  return;
}

Assistant:

static void hts_idx_save_core(const hts_idx_t *idx, void *fp, int fmt)
{
    int32_t i, size, is_be;
    int is_bgzf = (fmt != HTS_FMT_BAI);
    is_be = ed_is_big();
    if (is_be) {
        uint32_t x = idx->n;
        idx_write(is_bgzf, fp, ed_swap_4p(&x), 4);
    } else idx_write(is_bgzf, fp, &idx->n, 4);
    if (fmt == HTS_FMT_TBI && idx->l_meta) idx_write(is_bgzf, fp, idx->meta, idx->l_meta);
    for (i = 0; i < idx->n; ++i) {
        khint_t k;
        bidx_t *bidx = idx->bidx[i];
        lidx_t *lidx = &idx->lidx[i];
        // write binning index
        size = bidx? kh_size(bidx) : 0;
        if (is_be) { // big endian
            uint32_t x = size;
            idx_write(is_bgzf, fp, ed_swap_4p(&x), 4);
        } else idx_write(is_bgzf, fp, &size, 4);
        if (bidx == 0) goto write_lidx;
        for (k = kh_begin(bidx); k != kh_end(bidx); ++k) {
            bins_t *p;
            if (!kh_exist(bidx, k)) continue;
            p = &kh_value(bidx, k);
            if (is_be) { // big endian
                uint32_t x;
                x = kh_key(bidx, k); idx_write(is_bgzf, fp, ed_swap_4p(&x), 4);
                if (fmt == HTS_FMT_CSI) {
                    uint64_t y = kh_val(bidx, k).loff;
                    idx_write(is_bgzf, fp, ed_swap_4p(&y), 8);
                }
                x = p->n; idx_write(is_bgzf, fp, ed_swap_4p(&x), 4);
                swap_bins(p);
                idx_write(is_bgzf, fp, p->list, 16 * p->n);
                swap_bins(p);
            } else {
                idx_write(is_bgzf, fp, &kh_key(bidx, k), 4);
                if (fmt == HTS_FMT_CSI) idx_write(is_bgzf, fp, &kh_val(bidx, k).loff, 8);
                //int j;for(j=0;j<p->n;++j)fprintf(stderr,"%d,%llx,%d,%llx:%llx\n",kh_key(bidx,k),kh_val(bidx, k).loff,j,p->list[j].u,p->list[j].v);
                idx_write(is_bgzf, fp, &p->n, 4);
                idx_write(is_bgzf, fp, p->list, p->n << 4);
            }
        }
write_lidx:
        if (fmt != HTS_FMT_CSI) {
            if (is_be) {
                int32_t x = lidx->n;
                idx_write(is_bgzf, fp, ed_swap_4p(&x), 4);
                for (x = 0; x < lidx->n; ++x) ed_swap_8p(&lidx->offset[x]);
                idx_write(is_bgzf, fp, lidx->offset, lidx->n << 3);
                for (x = 0; x < lidx->n; ++x) ed_swap_8p(&lidx->offset[x]);
            } else {
                idx_write(is_bgzf, fp, &lidx->n, 4);
                idx_write(is_bgzf, fp, lidx->offset, lidx->n << 3);
            }
        }
    }
    if (is_be) { // write the number of reads without coordinates
        uint64_t x = idx->n_no_coor;
        idx_write(is_bgzf, fp, &x, 8);
    } else idx_write(is_bgzf, fp, &idx->n_no_coor, 8);
}